

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

size_t __thiscall
notch::io::PlainTextNetworkReader::read_header
          (PlainTextNetworkReader *this,istream *in,MakeNet *mknet)

{
  bool bVar1;
  runtime_error *prVar2;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  size_t local_60;
  size_t nLayers;
  size_t outputDim;
  size_t inputDim;
  string local_40 [4];
  float fmtVersion;
  string netTag;
  MakeNet *mknet_local;
  istream *in_local;
  PlainTextNetworkReader *this_local;
  
  std::__cxx11::string::string(local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"net:",&local_81);
  read_tag_value<std::__cxx11::string>
            (this,in,(string *)local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"Net");
  if (bVar1) {
    local_b9 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "unsupported network type: ");
    std::runtime_error::runtime_error(prVar2,local_b8);
    local_b9 = 0;
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"format:",&local_e1);
  read_tag_value<float>(this,in,(string *)local_e0,(float *)((long)&inputDim + 4));
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if ((inputDim._4_4_ == 1.0) && (!NAN(inputDim._4_4_))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"inputs:",&local_109);
    read_tag_value<unsigned_long>(this,in,(string *)local_108,&outputDim);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"outputs:",&local_131);
    read_tag_value<unsigned_long>(this,in,(string *)local_130,&nLayers);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"layers:",&local_159);
    read_tag_value<unsigned_long>(this,in,(string *)local_158,&local_60);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    consume_end_of_record(this,in);
    core::MakeNet::setInputDim(mknet,outputDim);
    std::__cxx11::string::~string(local_40);
    return local_60;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"unsupported version network format");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t read_header(std::istream &in, MakeNet &mknet) {
        std::string netTag;
        float fmtVersion;
        size_t inputDim;
        size_t outputDim;
        size_t nLayers;
        read_tag_value<std::string>(in, "net:", netTag);
        if (netTag != "Net") {
            throw std::runtime_error("unsupported network type: " + netTag);
        }
        read_tag_value<float>(in, "format:", fmtVersion);
        if (fmtVersion != 1.0) {
            throw std::runtime_error("unsupported version network format");
        }
        read_tag_value<size_t>(in, "inputs:", inputDim);
        read_tag_value<size_t>(in, "outputs:", outputDim); // ignore
        read_tag_value<size_t>(in, "layers:", nLayers);
        consume_end_of_record(in);
        mknet.setInputDim(inputDim);
        return nLayers;
    }